

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

int CMAC_ACPKM_Mesh(CMAC_ACPKM_CTX *ctx)

{
  EVP_CIPHER_CTX *ctx_00;
  int iVar1;
  uchar *iv;
  CMAC_ACPKM_CTX *in_RDI;
  int local_4;
  
  if (in_RDI->num < in_RDI->section_size) {
    local_4 = 1;
  }
  else {
    in_RDI->num = 0;
    iVar1 = CMAC_ACPKM_Master(in_RDI);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      ctx_00 = (EVP_CIPHER_CTX *)in_RDI->cctx;
      iv = (uchar *)EVP_CIPHER_CTX_iv(in_RDI->cctx);
      iVar1 = EVP_EncryptInit_ex(ctx_00,(EVP_CIPHER *)0x0,(ENGINE *)0x0,in_RDI->km,iv);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int CMAC_ACPKM_Mesh(CMAC_ACPKM_CTX *ctx)
{
    if (ctx->num < ctx->section_size)
        return 1;
    ctx->num = 0;
    if (!CMAC_ACPKM_Master(ctx))
        return 0;
    /* Restart cbc with new key */
    if (!EVP_EncryptInit_ex(ctx->cctx, NULL, NULL, ctx->km,
            EVP_CIPHER_CTX_iv(ctx->cctx)))
        return 0;
    return 1;
}